

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buffer.cpp
# Opt level: O0

value * __thiscall mpt::io::buffer::value(buffer *this)

{
  iterator __s;
  size_t __n;
  span<const_char> local_48;
  void *local_38;
  char *end;
  char *begin;
  span<const_unsigned_char> d;
  buffer *this_local;
  
  if (((this->super_encode_array)._state.scratch == 0) &&
     ((this->super_encode_array)._state.done != 0)) {
    d._len = (size_t)this;
    _begin = encode_array::data(&this->super_encode_array);
    __s = span<const_unsigned_char>::begin((span<const_unsigned_char> *)&begin);
    end = (char *)__s;
    __n = span<const_unsigned_char>::size((span<const_unsigned_char> *)&begin);
    local_38 = memchr(__s,0,__n);
    if (local_38 == (void *)0x0) {
      this_local = (buffer *)0x0;
    }
    else {
      span<const_char>::span(&local_48,end,(long)local_38 + (1 - (long)end));
      (this->_record)._base = local_48._base;
      (this->_record)._len = local_48._len;
      mpt::value::operator=(&this->_value,&this->_record);
      this_local = (buffer *)&this->_value;
    }
  }
  else {
    this_local = (buffer *)0x0;
  }
  return (value *)this_local;
}

Assistant:

const struct value *io::buffer::value()
{
	if (_state.scratch || !_state.done) {
		return 0;
	}
	span<const uint8_t> d = data();
	const char *begin = (const char *) d.begin();
	const char *end;
	if (!(end = (char *) memchr(begin, 0, d.size()))) {
		return 0;
	}
	// save current delimited data
	_record = span<const char>(begin, end + 1 - begin);
	_value = _record;
	return &_value;
}